

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

size_t anon_unknown.dwarf_323b29::collectPathsForDebug
                 (string *buffer,cmSearchPath *searchPath,size_t startIndex)

{
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *pvVar1;
  bool bVar2;
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *pvVar3;
  const_reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *local_38;
  size_t i;
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *paths;
  size_t startIndex_local;
  cmSearchPath *searchPath_local;
  string *buffer_local;
  
  paths = (vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *)
          startIndex;
  startIndex_local = (size_t)searchPath;
  searchPath_local = (cmSearchPath *)buffer;
  i = (size_t)cmSearchPath::GetPaths(searchPath);
  bVar2 = std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
          empty((vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                 *)i);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)searchPath_local,"  none\n");
    buffer_local = (string *)0x0;
  }
  else {
    local_38 = paths;
    while( true ) {
      pvVar1 = local_38;
      pvVar3 = (vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                *)std::
                  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                  ::size((vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                          *)i);
      if (pvVar3 <= pvVar1) break;
      __rhs = std::
              vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
              operator[]((vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                          *)i,(size_type)local_38);
      std::operator+(&local_78,"  ",&__rhs->Path);
      std::operator+(&local_58,&local_78,"\n");
      std::__cxx11::string::operator+=((string *)searchPath_local,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      local_38 = (vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                  *)((long)&(local_38->
                            super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    buffer_local = (string *)
                   std::
                   vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                   ::size((vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                           *)i);
  }
  return (size_t)buffer_local;
}

Assistant:

std::size_t collectPathsForDebug(std::string& buffer,
                                 cmSearchPath const& searchPath,
                                 std::size_t const startIndex = 0)
{
  const auto& paths = searchPath.GetPaths();
  if (paths.empty()) {
    buffer += "  none\n";
    return 0;
  }
  for (auto i = startIndex; i < paths.size(); i++) {
    buffer += "  " + paths[i].Path + "\n";
  }
  return paths.size();
}